

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool nlohmann::operator==(const_reference lhs,const_reference rhs)

{
  value_t vVar1;
  value_t vVar2;
  const_reference pvVar3;
  pointer __n;
  object_t *poVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  const_reference lhs_00;
  const_reference rhs_00;
  bool bVar8;
  
  vVar1 = lhs->m_type;
  vVar2 = rhs->m_type;
  if (vVar1 == vVar2) {
    bVar8 = true;
    switch(vVar1) {
    case null:
      goto switchD_001b2599_caseD_0;
    case object:
      poVar4 = (lhs->m_value).object;
      if ((poVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
          (((rhs->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
        bVar8 = std::__equal<false>::
                equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                          ((poVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                           (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                            )&(poVar4->_M_t)._M_impl.super__Rb_tree_header,
                           (((rhs->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                           _M_left);
        return bVar8;
      }
      break;
    case array:
      lhs_00 = (((lhs->m_value).array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (((lhs->m_value).array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      rhs_00 = (((rhs->m_value).array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((long)pvVar3 - (long)lhs_00 ==
          (long)(((rhs->m_value).array)->
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)rhs_00) {
        bVar8 = lhs_00 == pvVar3;
        if (bVar8) {
          return bVar8;
        }
        bVar6 = operator==(lhs_00,rhs_00);
        if (!bVar6) {
          return bVar8;
        }
        do {
          rhs_00 = rhs_00 + 1;
          lhs_00 = lhs_00 + 1;
          bVar8 = lhs_00 == pvVar3;
          if (bVar8) {
            return bVar8;
          }
          bVar6 = operator==(lhs_00,rhs_00);
        } while (bVar6);
        return bVar8;
      }
      break;
    case string:
      __n = (pointer)((lhs->m_value).string)->_M_string_length;
      if (__n == (((rhs->m_value).array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
        if (__n == (pointer)0x0) {
          return true;
        }
        iVar7 = bcmp((((lhs->m_value).string)->_M_dataplus)._M_p,
                     (((rhs->m_value).array)->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,(size_t)__n);
        return iVar7 == 0;
      }
      break;
    case boolean:
      return (lhs->m_value).boolean == (rhs->m_value).boolean;
    case number_integer:
    case number_unsigned:
switchD_001b2599_caseD_5:
      return (lhs->m_value).object == (rhs->m_value).object;
    case number_float:
      dVar5 = (rhs->m_value).number_float;
LAB_001b266a:
      bVar8 = dVar5 == (lhs->m_value).number_float;
LAB_001b2675:
      return (bool)(-bVar8 & 1);
    }
  }
  else {
    if (vVar1 == number_integer && (vVar2 ^ number_float) == null) {
      bVar8 = (double)(lhs->m_value).number_integer == (rhs->m_value).number_float;
      goto LAB_001b2675;
    }
    if (vVar1 == number_float && (vVar2 ^ number_integer) == null) {
      dVar5 = (double)(rhs->m_value).number_integer;
      goto LAB_001b266a;
    }
    if (vVar1 == number_unsigned && (vVar2 ^ number_float) == null) {
      bVar8 = ((double)CONCAT44(0x45300000,(int)((ulong)(lhs->m_value).number_integer >> 0x20)) -
              1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)(lhs->m_value).number_integer) - 4503599627370496.0)
              == (rhs->m_value).number_float;
      goto LAB_001b2675;
    }
    if (vVar1 == number_float && (vVar2 ^ number_unsigned) == null) {
      bVar8 = ((double)CONCAT44(0x45300000,(int)((ulong)(rhs->m_value).number_integer >> 0x20)) -
              1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)(rhs->m_value).number_integer) - 4503599627370496.0)
              == (lhs->m_value).number_float;
      goto LAB_001b2675;
    }
    if ((vVar1 == number_unsigned && (vVar2 ^ number_integer) == null) ||
       (vVar1 == number_integer && (vVar2 ^ number_unsigned) == null))
    goto switchD_001b2599_caseD_5;
  }
  bVar8 = false;
switchD_001b2599_caseD_0:
  return bVar8;
}

Assistant:

constexpr value_t type() const noexcept { return m_type; }